

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_string_field.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::cpp::StringFieldGenerator::GenerateAccessorDeclarations
          (StringFieldGenerator *this,Printer *printer)

{
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *variables;
  CType CVar1;
  CType CVar2;
  
  CVar1 = *(CType *)(*(long *)(this->descriptor_ + 0x80) + 0x68);
  CVar2 = EffectiveStringCType(this->descriptor_);
  if (CVar1 != CVar2) {
    io::Printer::Outdent(printer);
    io::Printer::Print(printer," private:\n  // Hidden due to unknown ctype option.\n");
    io::Printer::Indent(printer);
  }
  variables = &this->variables_;
  io::Printer::Print(printer,variables,
                     "$deprecated_attr$const ::std::string& $name$() const;\n$deprecated_attr$void set_$name$(const ::std::string& value);\n"
                    );
  if (*(char *)(*(long *)(*(long *)(this->descriptor_ + 0x30) + 0xa0) + 0xa7) == '\0') {
    io::Printer::Print(printer,variables,
                       "#if LANG_CXX11\n$deprecated_attr$void set_$name$(::std::string&& value);\n#endif\n"
                      );
  }
  io::Printer::Print(printer,variables,
                     "$deprecated_attr$void set_$name$(const char* value);\n$deprecated_attr$void set_$name$(const $pointer_type$* value, size_t size);\n$deprecated_attr$::std::string* mutable_$name$();\n$deprecated_attr$::std::string* $release_name$();\n$deprecated_attr$void set_allocated_$name$(::std::string* $name$);\n"
                    );
  if (*(char *)(*(long *)(*(long *)(this->descriptor_ + 0x30) + 0xa0) + 0xa7) == '\x01') {
    io::Printer::Print(printer,variables,
                       "$deprecated_attr$::std::string* unsafe_arena_release_$name$();\n$deprecated_attr$void unsafe_arena_set_allocated_$name$(\n    ::std::string* $name$);\n"
                      );
  }
  if (CVar1 == CVar2) {
    return;
  }
  io::Printer::Outdent(printer);
  io::Printer::Print(printer," public:\n");
  io::Printer::Indent(printer);
  return;
}

Assistant:

void StringFieldGenerator::
GenerateAccessorDeclarations(io::Printer* printer) const {
  // If we're using StringFieldGenerator for a field with a ctype, it's
  // because that ctype isn't actually implemented.  In particular, this is
  // true of ctype=CORD and ctype=STRING_PIECE in the open source release.
  // We aren't releasing Cord because it has too many Google-specific
  // dependencies and we aren't releasing StringPiece because it's hardly
  // useful outside of Google and because it would get confusing to have
  // multiple instances of the StringPiece class in different libraries (PCRE
  // already includes it for their C++ bindings, which came from Google).
  //
  // In any case, we make all the accessors private while still actually
  // using a string to represent the field internally.  This way, we can
  // guarantee that if we do ever implement the ctype, it won't break any
  // existing users who might be -- for whatever reason -- already using .proto
  // files that applied the ctype.  The field can still be accessed via the
  // reflection interface since the reflection interface is independent of
  // the string's underlying representation.

  bool unknown_ctype =
      descriptor_->options().ctype() != EffectiveStringCType(descriptor_);

  if (unknown_ctype) {
    printer->Outdent();
    printer->Print(
      " private:\n"
      "  // Hidden due to unknown ctype option.\n");
    printer->Indent();
  }

  printer->Print(variables_,
    "$deprecated_attr$const ::std::string& $name$() const;\n"
    "$deprecated_attr$void set_$name$(const ::std::string& value);\n");

  if (!SupportsArenas(descriptor_)) {
    printer->Print(variables_,
      "#if LANG_CXX11\n"
      "$deprecated_attr$void set_$name$(::std::string&& value);\n"
      "#endif\n");
  }

  printer->Print(variables_,
    "$deprecated_attr$void set_$name$(const char* value);\n"
    "$deprecated_attr$void set_$name$(const $pointer_type$* value, size_t size)"
                 ";\n"
    "$deprecated_attr$::std::string* mutable_$name$();\n"
    "$deprecated_attr$::std::string* $release_name$();\n"
    "$deprecated_attr$void set_allocated_$name$(::std::string* $name$);\n");
  if (SupportsArenas(descriptor_)) {
    printer->Print(variables_,
      "$deprecated_attr$::std::string* unsafe_arena_release_$name$();\n"
      "$deprecated_attr$void unsafe_arena_set_allocated_$name$(\n"
      "    ::std::string* $name$);\n");
  }


  if (unknown_ctype) {
    printer->Outdent();
    printer->Print(" public:\n");
    printer->Indent();
  }
}